

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_false>::move_
          (DaTrie<false,_true,_false> *this,uint32_t node_pos,uint32_t base,Edge *edge,Query *query)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  size_t sVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  Edge *in_RCX;
  uint in_EDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  Query *in_R8;
  uint32_t src_child_pos;
  uint8_t src_label;
  uint8_t *__end3;
  uint8_t *__begin3;
  Edge *__range3;
  uint32_t src_base;
  Edge src_edge;
  uint32_t dst_node_pos;
  uint32_t src_node_pos;
  uint8_t label;
  uint8_t *__end2;
  uint8_t *__begin2;
  Edge *__range2;
  uint32_t orig_base;
  DaTrie<false,_true,_false> *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  DaTrie<false,_true,_false> *in_stack_fffffffffffffe88;
  DaTrie<false,_true,_false> *in_stack_fffffffffffffe90;
  Edge local_158;
  uint local_4c;
  uint local_48;
  byte local_41;
  byte *local_40;
  byte *local_38;
  Edge *local_30;
  uint32_t local_24;
  Query *local_20;
  Edge *local_18;
  uint local_10;
  uint local_c;
  
  uVar5 = (ulong)in_ESI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (sVar6 <= uVar5) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x2db,
                  "void ddd::DaTrie<false, true, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = false, WithNLM = true, Prefix = false]"
                 );
  }
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_c);
  bVar3 = Bc::is_fixed(pvVar7);
  if (!bVar3) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x2dc,
                  "void ddd::DaTrie<false, true, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = false, WithNLM = true, Prefix = false]"
                 );
  }
  sVar8 = Edge::size(local_18);
  if (sVar8 != 0) {
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_c);
    local_24 = Bc::base(pvVar7);
    local_30 = local_18;
    local_38 = Edge::begin(local_18);
    local_40 = Edge::end(local_30);
    for (; uVar4 = (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20), local_38 != local_40;
        local_38 = local_38 + 1) {
      local_41 = *local_38;
      local_48 = local_24 ^ local_41;
      local_4c = local_10 ^ local_41;
      fix_(in_stack_fffffffffffffe70,(uint32_t)(uVar5 >> 0x20),
           (vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_RDI);
      pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_48);
      pvVar9 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_4c);
      *pvVar9 = *pvVar7;
      pvVar10 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                          ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                           (ulong)local_48);
      pvVar11 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                          ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                           (ulong)local_4c);
      *pvVar11 = *pvVar10;
      Edge::Edge(&local_158);
      edge_(in_stack_fffffffffffffe90,uVar4,
            (Edge *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
            in_stack_fffffffffffffe78);
      pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_48);
      uVar4 = Bc::base(pvVar7);
      in_stack_fffffffffffffe90 = (DaTrie<false,_true,_false> *)Edge::begin(&local_158);
      in_stack_fffffffffffffe88 = (DaTrie<false,_true,_false> *)Edge::end(&local_158);
      for (; in_stack_fffffffffffffe90 != in_stack_fffffffffffffe88;
          in_stack_fffffffffffffe90 =
               (DaTrie<false,_true,_false> *)
               ((long)&(in_stack_fffffffffffffe90->bc_).
                       super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start + 1)) {
        bVar1 = *(byte *)&(in_stack_fffffffffffffe90->bc_).
                          super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                          super__Vector_impl_data._M_start;
        in_stack_fffffffffffffe84 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe84);
        in_stack_fffffffffffffe80 = uVar4 ^ bVar1;
        pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           (in_RDI,(ulong)in_stack_fffffffffffffe80);
        Bc::set_check(pvVar7,local_4c);
      }
      unfix_(in_stack_fffffffffffffe70,(uint32_t)(uVar5 >> 0x20),
             (vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_RDI);
      uVar2 = local_48;
      uVar4 = Query::node_pos(local_20);
      if (uVar2 == uVar4) {
        Query::set_node_pos(local_20,local_4c);
      }
      Edge::~Edge(&local_158);
    }
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_c);
    Bc::set_base(pvVar7,local_10);
    return;
  }
  __assert_fail("0 < edge.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x2dd,
                "void ddd::DaTrie<false, true, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = false, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void move_(uint32_t node_pos, uint32_t base, const Edge& edge, Query& query) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(0 < edge.size());

    auto orig_base = bc_[node_pos].base();

    for (auto label : edge) {
      auto src_node_pos = orig_base ^label;
      auto dst_node_pos = base ^label;

      fix_(dst_node_pos, blocks_);
      bc_[dst_node_pos] = bc_[src_node_pos];
      if (WithNLM) {
        node_links_[dst_node_pos] = node_links_[src_node_pos];
      }

      Edge src_edge;
      edge_(src_node_pos, src_edge);

      auto src_base = bc_[src_node_pos].base();
      for (auto src_label : src_edge) {
        auto src_child_pos = src_base ^src_label;
        bc_[src_child_pos].set_check(dst_node_pos);
      }

      unfix_(src_node_pos, blocks_);

      if (src_node_pos == query.node_pos()) {
        query.set_node_pos(dst_node_pos);
      }
    }

    bc_[node_pos].set_base(base);
  }